

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::MaxTextureLevels
          (TextureAttachmentTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 *puVar3;
  double dVar4;
  GLint max_texture_size;
  undefined1 local_14 [4];
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if ((int)texture_target < 0x8513) {
    if (texture_target != 0xde1) {
      if (texture_target == 0x84f5) {
        return 1;
      }
LAB_00a984f1:
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    (**(code **)(lVar2 + 0x868))(0xd33,local_14);
    err = (**(code **)(lVar2 + 0x800))();
    iVar1 = 0x2c5;
  }
  else {
    if (texture_target != 0x8513) {
      if (texture_target == 0x9100) {
        return 1;
      }
      goto LAB_00a984f1;
    }
    (**(code **)(lVar2 + 0x868))(0x851c,local_14);
    err = (**(code **)(lVar2 + 0x800))();
    iVar1 = 0x2cb;
  }
  glu::checkError(err,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,iVar1);
  dVar4 = ::log(1024.0);
  return (GLuint)(long)dVar4;
}

Assistant:

glw::GLuint TextureAttachmentTest::MaxTextureLevels(glw::GLenum texture_target)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_texture_size = 1024 /* Specification default. */;

	switch (texture_target)
	{
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_2D_MULTISAMPLE:
		return 1;

	case GL_TEXTURE_2D:
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (glw::GLuint)std::log((double)max_texture_size);

	case GL_TEXTURE_CUBE_MAP:
		gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (glw::GLuint)std::log((double)max_texture_size);

	default:
		throw 0;
	}

	/* For compiler warnings only. */
	return 0;
}